

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.cc
# Opt level: O1

void RunManyThreadsWithId(_func_void_int *fn,int count)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (_func_void_int *)0x0;
  local_38._8_8_ = 0;
  if (fn != (_func_void_int *)0x0) {
    pcStack_20 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
    local_28 = std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
    local_38._M_unused._0_8_ = (undefined8)fn;
  }
  RunMany((function<void_(int)> *)&local_38,count);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void RunManyThreadsWithId(void (*fn)(int), int count) {
    RunMany(fn, count);
  }